

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O2

void xmrig::cryptonight_triple_hash<false>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  cryptonight_ctx *pcVar1;
  cryptonight_ctx *pcVar2;
  cryptonight_ctx *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  __m128i bx0;
  __m128i bx0_00;
  __m128i bx0_01;
  __m128i bx1;
  __m128i bx1_00;
  __m128i bx1_01;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  uint8_t *l;
  uint8_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t i;
  long lVar25;
  ulong uVar26;
  uint8_t *puVar27;
  size_t i_1;
  ulong uVar28;
  long extraout_XMM0_Qa;
  long extraout_XMM0_Qa_00;
  long extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong uVar33;
  __m128i ax0;
  __m128i ax0_00;
  __m128i ax0_01;
  longlong in_stack_fffffffffffffe18;
  uint64_t *mem_out;
  uint8_t *puVar34;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  ulong local_1a8;
  ulong uStack_1a0;
  long local_198;
  ulong local_188;
  long local_178;
  ulong local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  uint8_t *local_c8;
  uint8_t *local_c0;
  uint8_t *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  __m128i *local_98;
  ulong local_90;
  long local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar20 = extra_iters + 0x40000;
  local_c8 = output;
  for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
    pcVar1 = ctx[lVar25];
    keccak(input,size,pcVar1->state);
    cn_explode_scratchpad<false>((__m128i *)pcVar1,(__m128i *)pcVar1->memory);
    input = input + size;
  }
  pcVar1 = *ctx;
  pcVar2 = ctx[1];
  local_b8 = pcVar1->memory;
  local_c0 = pcVar2->memory;
  pcVar3 = ctx[2];
  puVar27 = pcVar3->memory;
  local_78 = *(ulong *)(pcVar1->state + 0x60);
  uStack_70 = 0;
  local_88 = *(long *)(pcVar1->state + 0x68);
  uStack_80 = 0;
  local_118 = *(uint *)(pcVar1->state + 0x20) ^ *(uint *)pcVar1->state;
  uStack_114 = *(uint *)(pcVar1->state + 0x24) ^ *(uint *)(pcVar1->state + 4);
  uStack_110 = *(uint *)(pcVar1->state + 0x28) ^ *(uint *)(pcVar1->state + 8);
  uStack_10c = *(uint *)(pcVar1->state + 0x2c) ^ *(uint *)(pcVar1->state + 0xc);
  local_158 = CONCAT44(*(uint *)(pcVar1->state + 0x34) ^ *(uint *)(pcVar1->state + 0x14),
                       *(uint *)(pcVar1->state + 0x30) ^ *(uint *)(pcVar1->state + 0x10));
  uStack_150 = CONCAT44(*(uint *)(pcVar1->state + 0x3c) ^ *(uint *)(pcVar1->state + 0x1c),
                        *(uint *)(pcVar1->state + 0x38) ^ *(uint *)(pcVar1->state + 0x18));
  local_108 = CONCAT44(*(uint *)(pcVar1->state + 0x54) ^ *(uint *)(pcVar1->state + 0x44),
                       *(uint *)(pcVar1->state + 0x50) ^ *(uint *)(pcVar1->state + 0x40));
  uStack_100 = CONCAT44(*(uint *)(pcVar1->state + 0x5c) ^ *(uint *)(pcVar1->state + 0x4c),
                        *(uint *)(pcVar1->state + 0x58) ^ *(uint *)(pcVar1->state + 0x48));
  local_168 = *(ulong *)(pcVar2->state + 0x60);
  local_178 = *(long *)(pcVar2->state + 0x68);
  local_138 = *(uint *)(pcVar2->state + 0x20) ^ *(uint *)pcVar2->state;
  uStack_134 = *(uint *)(pcVar2->state + 0x24) ^ *(uint *)(pcVar2->state + 4);
  uStack_130 = *(uint *)(pcVar2->state + 0x28) ^ *(uint *)(pcVar2->state + 8);
  uStack_12c = *(uint *)(pcVar2->state + 0x2c) ^ *(uint *)(pcVar2->state + 0xc);
  local_148 = CONCAT44(*(uint *)(pcVar2->state + 0x34) ^ *(uint *)(pcVar2->state + 0x14),
                       *(uint *)(pcVar2->state + 0x30) ^ *(uint *)(pcVar2->state + 0x10));
  uStack_140 = CONCAT44(*(uint *)(pcVar2->state + 0x3c) ^ *(uint *)(pcVar2->state + 0x1c),
                        *(uint *)(pcVar2->state + 0x38) ^ *(uint *)(pcVar2->state + 0x18));
  local_1c8 = CONCAT44(*(uint *)(pcVar2->state + 0x54) ^ *(uint *)(pcVar2->state + 0x44),
                       *(uint *)(pcVar2->state + 0x50) ^ *(uint *)(pcVar2->state + 0x40));
  uStack_1c0 = CONCAT44(*(uint *)(pcVar2->state + 0x5c) ^ *(uint *)(pcVar2->state + 0x4c),
                        *(uint *)(pcVar2->state + 0x58) ^ *(uint *)(pcVar2->state + 0x48));
  local_188 = *(ulong *)(pcVar3->state + 0x60);
  local_198 = *(long *)(pcVar3->state + 0x68);
  local_128 = *(uint *)(pcVar3->state + 0x20) ^ *(uint *)pcVar3->state;
  uStack_124 = *(uint *)(pcVar3->state + 0x24) ^ *(uint *)(pcVar3->state + 4);
  uStack_120 = *(uint *)(pcVar3->state + 0x28) ^ *(uint *)(pcVar3->state + 8);
  uStack_11c = *(uint *)(pcVar3->state + 0x2c) ^ *(uint *)(pcVar3->state + 0xc);
  local_e8 = CONCAT44(*(uint *)(pcVar3->state + 0x34) ^ *(uint *)(pcVar3->state + 0x14),
                      *(uint *)(pcVar3->state + 0x30) ^ *(uint *)(pcVar3->state + 0x10));
  uStack_e0 = CONCAT44(*(uint *)(pcVar3->state + 0x3c) ^ *(uint *)(pcVar3->state + 0x1c),
                       *(uint *)(pcVar3->state + 0x38) ^ *(uint *)(pcVar3->state + 0x18));
  local_f8 = CONCAT44(*(uint *)(pcVar3->state + 0x54) ^ *(uint *)(pcVar3->state + 0x44),
                      *(uint *)(pcVar3->state + 0x50) ^ *(uint *)(pcVar3->state + 0x40));
  uStack_f0 = CONCAT44(*(uint *)(pcVar3->state + 0x5c) ^ *(uint *)(pcVar3->state + 0x4c),
                       *(uint *)(pcVar3->state + 0x58) ^ *(uint *)(pcVar3->state + 0x48));
  fesetround(0x400);
  l = local_c0;
  uVar28 = CONCAT44(uStack_114,local_118);
  uVar22 = CONCAT44(uStack_134,local_138);
  uVar21 = CONCAT44(uStack_124,local_128);
  uVar20 = uVar20 >> 1 & 0xffffffff;
  while (puVar15 = local_b8, uVar20 != 0) {
    uVar28 = uVar28 & 0xffff0;
    uVar22 = uVar22 & 0xffff0;
    auVar32 = *(undefined1 (*) [16])(l + uVar22);
    uVar21 = uVar21 & 0xffff0;
    mem_out = (uint64_t *)(puVar27 + uVar21);
    auVar4 = *(undefined1 (*) [16])(puVar27 + uVar21);
    auVar12._4_4_ = uStack_114;
    auVar12._0_4_ = local_118;
    auVar12._8_4_ = uStack_110;
    auVar12._12_4_ = uStack_10c;
    local_68 = aesenc(*(undefined1 (*) [16])(local_b8 + uVar28),auVar12);
    bx0[1] = (longlong)mem_out;
    bx0[0] = in_stack_fffffffffffffe18;
    bx1[1] = (longlong)puVar27;
    bx1[0] = (longlong)ctx;
    ax0[1] = height;
    ax0[0] = (longlong)local_48;
    puVar34 = puVar27;
    local_90 = uVar20 - 1;
    local_48 = local_68;
    cryptonight_monero_tweak
              ((uint64_t *)(local_b8 + uVar28),local_b8,uVar28,ax0,bx0,bx1,(__m128i *)extra_iters);
    auVar10._4_4_ = uStack_134;
    auVar10._0_4_ = local_138;
    auVar10._8_4_ = uStack_130;
    auVar10._12_4_ = uStack_12c;
    auVar31 = aesenc(auVar32,auVar10);
    bx0_00[1] = (longlong)mem_out;
    bx0_00[0] = in_stack_fffffffffffffe18;
    bx1_00[1] = (longlong)puVar34;
    bx1_00[0] = (longlong)ctx;
    ax0_00[1] = height;
    ax0_00[0] = (longlong)local_58;
    local_58 = auVar31;
    cryptonight_monero_tweak
              ((uint64_t *)(l + uVar22),l,uVar22,ax0_00,bx0_00,bx1_00,(__m128i *)extra_iters);
    auVar11._4_4_ = uStack_124;
    auVar11._0_4_ = local_128;
    auVar11._8_4_ = uStack_120;
    auVar11._12_4_ = uStack_11c;
    auVar32 = aesenc(auVar4,auVar11);
    bx0_01[1] = (longlong)mem_out;
    bx0_01[0] = in_stack_fffffffffffffe18;
    bx1_01[1] = (longlong)puVar34;
    bx1_01[0] = (longlong)ctx;
    ax0_01[1] = height;
    ax0_01[0] = (longlong)local_d8;
    local_d8 = auVar32;
    cryptonight_monero_tweak(mem_out,puVar27,uVar21,ax0_01,bx0_01,bx1_01,(__m128i *)extra_iters);
    uVar13 = local_68._0_8_;
    uVar26 = local_68._0_8_ & 0xffff0;
    uVar28 = local_88 << 0x20 ^ local_78 ^ *(ulong *)(puVar15 + uVar26);
    uVar20 = (ulong)(local_68._0_4_ + (int)local_88 * 2 & 0x7ffffffe) | 0x80000001;
    local_1a8 = auVar31._0_8_;
    local_a8 = local_1a8;
    uVar24 = local_1a8 & 0xffff0;
    local_1b8 = auVar32._0_8_;
    local_a0 = local_1b8;
    local_78 = (ulong)local_68._8_8_ / uVar20 & 0xffffffff | (ulong)local_68._8_8_ % uVar20 << 0x20;
    local_1b8 = local_1b8 & 0xffff0;
    uStack_70 = 0;
    uVar20 = *(ulong *)(puVar15 + uVar26 + 8);
    local_b0 = local_178 << 0x20 ^ local_168 ^ *(ulong *)(l + uVar24);
    uVar21 = *(ulong *)(l + uVar24 + 8);
    local_98 = (__m128i *)(local_198 << 0x20 ^ local_188 ^ *(ulong *)(puVar34 + local_1b8));
    uVar29 = *(ulong *)(puVar34 + local_1b8 + 8);
    int_sqrt_v2(local_78 + local_68._0_8_);
    uVar17 = local_a8;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar28;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar13;
    uVar19 = SUB168(auVar32 * auVar5,8);
    uVar16 = SUB168(auVar32 * auVar5,0);
    uVar30 = *(ulong *)(puVar15 + (uVar26 ^ 0x10));
    uVar18 = *(ulong *)((long)(puVar15 + (uVar26 ^ 0x10)) + 8);
    uVar23 = uVar26 ^ 0x20;
    uVar22 = *(ulong *)(puVar15 + uVar23);
    uVar33 = *(ulong *)(puVar15 + uVar23 + 8);
    lVar25 = *(long *)((long)(puVar15 + (uVar26 ^ 0x30)) + 8);
    lVar8 = *(long *)(puVar15 + uVar23);
    lVar9 = *(long *)((long)(puVar15 + uVar23) + 8);
    *(long *)(puVar15 + (uVar26 ^ 0x10)) = local_108 + *(long *)(puVar15 + (uVar26 ^ 0x30));
    *(long *)((long)(puVar15 + (uVar26 ^ 0x10)) + 8) = uStack_100 + lVar25;
    *(ulong *)(puVar15 + uVar23) = (uVar19 ^ uVar30) + local_158;
    *(ulong *)((long)(puVar15 + uVar23) + 8) = (uVar16 ^ uVar18) + uStack_150;
    *(long *)(puVar15 + (uVar26 ^ 0x30)) = lVar8 + CONCAT44(uStack_114,local_118);
    *(long *)((long)(puVar15 + (uVar26 ^ 0x30)) + 8) = lVar9 + CONCAT44(uStack_10c,uStack_110);
    uVar30 = (uVar19 ^ uVar22) + CONCAT44(uStack_114,local_118);
    uVar33 = (uVar16 ^ uVar33) + CONCAT44(uStack_10c,uStack_110);
    *(ulong *)(puVar15 + uVar26) = uVar30;
    *(ulong *)((long)(puVar15 + uVar26) + 8) = uVar33;
    uStack_1a0 = auVar31._8_8_;
    uVar22 = (ulong)((int)local_a8 + (int)local_178 * 2 & 0x7ffffffe) | 0x80000001;
    uVar28 = uVar28 ^ uVar30;
    uVar20 = uVar20 ^ uVar33;
    local_118 = (uint)uVar28;
    uStack_114 = (uint)(uVar28 >> 0x20);
    uStack_110 = (uint)uVar20;
    uStack_10c = (uint)(uVar20 >> 0x20);
    local_168 = uStack_1a0 / uVar22 & 0xffffffff | uStack_1a0 % uVar22 << 0x20;
    local_88 = extraout_XMM0_Qa;
    uStack_80 = extraout_XMM0_Qb;
    int_sqrt_v2(local_168 + local_a8);
    uVar18 = local_a0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_b0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar17;
    uVar16 = SUB168(auVar4 * auVar6,8);
    uVar17 = SUB168(auVar4 * auVar6,0);
    uVar22 = *(ulong *)(l + (uVar24 ^ 0x10));
    uVar30 = *(ulong *)((long)(l + (uVar24 ^ 0x10)) + 8);
    uVar19 = uVar24 ^ 0x20;
    uVar20 = *(ulong *)(l + uVar19);
    uVar33 = *(ulong *)(l + uVar19 + 8);
    lVar25 = *(long *)((long)(l + (uVar24 ^ 0x30)) + 8);
    lVar8 = *(long *)(l + uVar19);
    lVar9 = *(long *)((long)(l + uVar19) + 8);
    *(ulong *)(l + (uVar24 ^ 0x10)) = local_1c8 + *(long *)(l + (uVar24 ^ 0x30));
    *(ulong *)((long)(l + (uVar24 ^ 0x10)) + 8) = uStack_1c0 + lVar25;
    *(ulong *)(l + uVar19) = (uVar16 ^ uVar22) + local_148;
    *(ulong *)((long)(l + uVar19) + 8) = (uVar17 ^ uVar30) + uStack_140;
    *(long *)(l + (uVar24 ^ 0x30)) = lVar8 + CONCAT44(uStack_134,local_138);
    *(long *)((long)(l + (uVar24 ^ 0x30)) + 8) = lVar9 + CONCAT44(uStack_12c,uStack_130);
    uVar22 = (uVar16 ^ uVar20) + CONCAT44(uStack_134,local_138);
    uVar33 = (uVar17 ^ uVar33) + CONCAT44(uStack_12c,uStack_130);
    *(ulong *)(l + uVar24) = uVar22;
    *(ulong *)((long)(l + uVar24) + 8) = uVar33;
    uVar13 = local_d8._0_8_;
    uVar14 = local_d8._8_8_;
    uVar20 = (ulong)((int)local_a0 + (int)local_198 * 2 & 0x7ffffffe) | 0x80000001;
    uVar22 = local_b0 ^ uVar22;
    uVar21 = uVar21 ^ uVar33;
    local_138 = (uint)uVar22;
    uStack_134 = (uint)(uVar22 >> 0x20);
    uStack_130 = (uint)uVar21;
    uStack_12c = (uint)(uVar21 >> 0x20);
    local_188 = (ulong)local_d8._8_8_ / uVar20 & 0xffffffff | (ulong)local_d8._8_8_ % uVar20 << 0x20
    ;
    height = (uint64_t)puVar34;
    int_sqrt_v2(local_188 + local_a0);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_98;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar18;
    uVar17 = SUB168(auVar31 * auVar7,8);
    uVar18 = SUB168(auVar31 * auVar7,0);
    uVar21 = *(ulong *)(height + (local_1b8 ^ 0x10));
    uVar30 = ((ulong *)(height + (local_1b8 ^ 0x10)))[1];
    uVar16 = local_1b8 ^ 0x20;
    uVar20 = *(ulong *)(height + uVar16);
    uVar33 = *(ulong *)(height + uVar16 + 8);
    lVar25 = ((long *)(height + (local_1b8 ^ 0x30)))[1];
    lVar8 = *(long *)(height + uVar16);
    lVar9 = ((long *)(height + uVar16))[1];
    *(long *)(height + (local_1b8 ^ 0x10)) = local_f8 + *(long *)(height + (local_1b8 ^ 0x30));
    ((long *)(height + (local_1b8 ^ 0x10)))[1] = uStack_f0 + lVar25;
    local_f8 = local_e8;
    uStack_f0 = uStack_e0;
    *(long *)(height + uVar16) = (uVar17 ^ uVar21) + local_e8;
    ((long *)(height + uVar16))[1] = (uVar18 ^ uVar30) + uStack_e0;
    *(long *)(height + (local_1b8 ^ 0x30)) = lVar8 + CONCAT44(uStack_124,local_128);
    ((long *)(height + (local_1b8 ^ 0x30)))[1] = lVar9 + CONCAT44(uStack_11c,uStack_120);
    uVar21 = (uVar17 ^ uVar20) + CONCAT44(uStack_124,local_128);
    uVar20 = (uVar18 ^ uVar33) + CONCAT44(uStack_11c,uStack_120);
    *(ulong *)(height + local_1b8) = uVar21;
    ((ulong *)(height + local_1b8))[1] = uVar20;
    uVar21 = (ulong)local_98 ^ uVar21;
    uVar29 = uVar29 ^ uVar20;
    local_128 = (uint)uVar21;
    uStack_124 = (uint)(uVar21 >> 0x20);
    uStack_120 = (uint)uVar29;
    uStack_11c = (uint)(uVar29 >> 0x20);
    local_e8 = uVar13;
    uStack_e0 = uVar14;
    local_1c8 = local_148;
    uStack_1c0 = uStack_140;
    local_148 = local_1a8;
    uStack_140 = uStack_1a0;
    uVar20 = local_90;
    extra_iters = (uint64_t)local_98;
    local_108 = local_158;
    uStack_100 = uStack_150;
    local_158 = local_68._0_8_;
    uStack_150 = local_68._8_8_;
    puVar27 = (uint8_t *)height;
    local_198 = extraout_XMM0_Qa_01;
    local_178 = extraout_XMM0_Qa_00;
  }
  puVar27 = local_c8;
  for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
    pcVar1 = ctx[lVar25];
    cn_implode_scratchpad<false>((__m128i *)pcVar1->memory,(__m128i *)pcVar1);
    keccakf((uint64_t *)pcVar1,0x18);
    (*(code *)(&extra_hashes)[(byte)*(longlong *)pcVar1->state & 3])(pcVar1,200,puVar27);
    puVar27 = puVar27 + 0x20;
  }
  return;
}

Assistant:

inline void cryptonight_triple_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    for (size_t i = 0; i < 3; i++) {
        keccak(input + size * i, size, ctx[i]->state);
        cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->state), reinterpret_cast<__m128i*>(ctx[i]->memory));
    }

    uint8_t* l0  = ctx[0]->memory;
    uint8_t* l1  = ctx[1]->memory;
    uint8_t* l2  = ctx[2]->memory;
    uint64_t* h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t* h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);
    uint64_t* h2 = reinterpret_cast<uint64_t*>(ctx[2]->state);

    CONST_INIT(ctx[0], 0);
    CONST_INIT(ctx[1], 1);
    CONST_INIT(ctx[2], 2);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t idx0, idx1, idx2;
    idx0 = _mm_cvtsi128_si64(ax0);
    idx1 = _mm_cvtsi128_si64(ax1);
    idx2 = _mm_cvtsi128_si64(ax2);

    for (size_t i = 0; i < iters; i++) {
        uint64_t hi, lo;
        __m128i *ptr0, *ptr1, *ptr2;

        CN_STEP1(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP1(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP1(ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP2(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP2(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP2(ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP3(0, ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP3(1, ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP3(2, ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP4(0, ax0, bx00, bx01, cx0, l0, mc0, ptr0, idx0);
        CN_STEP4(1, ax1, bx10, bx11, cx1, l1, mc1, ptr1, idx1);
        CN_STEP4(2, ax2, bx20, bx21, cx2, l2, mc2, ptr2, idx2);
    }

    for (size_t i = 0; i < 3; i++) {
        cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->memory), reinterpret_cast<__m128i*>(ctx[i]->state));
        keccakf(reinterpret_cast<uint64_t*>(ctx[i]->state), 24);
        extra_hashes[ctx[i]->state[0] & 3](ctx[i]->state, 200, output + 32 * i);
    }
}